

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_ExrIO_Test::TestBody(Image_ExrIO_Test *this)

{
  float *pfVar1;
  PixelFormat format_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  RGBColorSpace *expected;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Allocator AVar7;
  RGBColorSpace *actual;
  float fVar8;
  uint uVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  float *pfVar14;
  ColorEncodingHandle *encoding;
  AssertHelperData *expected_predicate_value;
  char *__end;
  ulong uVar15;
  ulong uVar16;
  char *__end_1;
  Point2i PVar17;
  long *plVar18;
  undefined1 auVar19 [16];
  Float FVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  AssertionResult gtest_ar__1;
  PixelFormat format;
  ImageChannelDesc rgbDesc;
  AssertionResult gtest_ar_;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageAndMetadata read;
  Image image;
  AssertHelper local_588;
  AssertHelper local_580;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  AssertHelper local_570;
  PixelFormat local_564;
  ImageChannelDesc local_560;
  undefined1 local_530 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  undefined1 *local_510;
  size_t local_508;
  undefined1 local_500 [16];
  long *local_4f0 [2];
  long local_4e0 [3];
  ulong local_4c8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_4c0;
  undefined1 **local_4a0;
  undefined1 *local_498;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [32];
  long local_450 [2];
  long local_440 [13];
  polymorphic_allocator<unsigned_char> local_3d8;
  uchar *local_3d0;
  size_t local_3c8;
  size_t local_3c0;
  polymorphic_allocator<pbrt::Half> local_3b8;
  Half *local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  polymorphic_allocator<float> local_398;
  float *local_390;
  size_t local_388;
  size_t local_380;
  ImageMetadata local_378;
  long local_278;
  long local_270;
  ColorEncodingHandle local_268;
  ColorEncodingHandle local_260;
  PixelFormat local_254 [3];
  Image local_248;
  aligned_storage_t<sizeof(float),_alignof(float)> local_130;
  uint uStack_12c;
  undefined1 local_e8;
  undefined1 local_a4;
  undefined1 local_90;
  undefined1 local_84;
  undefined1 local_7c;
  undefined1 local_74;
  RGBColorSpace *local_70;
  undefined1 local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  GetFloatPixels(&local_4c0,(Point2i)0x3100000010,3);
  local_498 = local_470;
  local_254[0] = U256;
  local_254[1] = Half;
  local_4a0 = &local_510;
  local_254[2] = 2;
  lVar11 = 0;
  do {
    local_490._0_8_ = local_480;
    format_00 = *(PixelFormat *)((long)local_254 + lVar11);
    local_564 = format_00;
    local_278 = lVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"R","");
    local_470._0_8_ = local_470 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"G","");
    local_450[0] = (long)local_440;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"B","");
    local_260.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_260;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490;
    pbrt::Image::Image(&local_248,format_00,(Point2i)0x3100000010,channels,encoding,AVar7);
    lVar11 = -0x60;
    plVar18 = local_440;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    local_490._0_4_ = U256;
    local_490._4_4_ = 0;
    local_490._8_4_ = 0x10;
    local_490._12_4_ = 0x31;
    buf.n = local_4c0.nStored;
    buf.ptr = local_4c0.ptr;
    pbrt::Image::CopyRectIn(&local_248,(Bounds2i *)local_490,buf);
    lVar11 = 0;
    uVar15 = 0;
    do {
      local_4e0[2] = lVar11 << 0x20;
      uVar16 = 0;
      local_270 = lVar11;
      do {
        PVar17.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_4e0[2] | uVar16);
        lVar12 = 0;
        lVar11 = (long)(int)uVar15 * 4;
        local_4c8 = uVar15;
        do {
          pfVar1 = local_4c0.ptr;
          if (local_564 == Float) {
            local_130 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                        pbrt::Image::GetChannel
                                  (&local_248,PVar17,(int)lVar12,(WrapMode2D)0x200000002);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_490,"rgbPixels[offset]","image.GetChannel({x, y}, c)",
                       (float *)((long)pfVar1 + lVar11),(float *)&local_130);
            if (local_490[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_130.__align);
              if ((undefined8 *)CONCAT44(local_490._12_4_,local_490._8_4_) == (undefined8 *)0x0) {
                pcVar13 = "";
              }
              else {
                pcVar13 = *(char **)CONCAT44(local_490._12_4_,local_490._8_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_530,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x159,pcVar13);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_530,(Message *)&local_130.__align);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_530);
              if (((CONCAT44(uStack_12c,local_130) != 0) &&
                  (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 ((long *)CONCAT44(uStack_12c,local_130) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(uStack_12c,local_130) + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_490 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_0030def8:
              local_248.p32.nStored = 0;
              (*(local_248.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                        (local_248.p32.alloc.memoryResource,local_248.p32.ptr,
                         local_248.p32.nAlloc << 2,4);
              local_248.p16.nStored = 0;
              (*(local_248.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                        (local_248.p16.alloc.memoryResource,local_248.p16.ptr,
                         local_248.p16.nAlloc * 2,2);
              local_248.p8.nStored = 0;
              (*(local_248.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                        (local_248.p8.alloc.memoryResource,local_248.p8.ptr,local_248.p8.nAlloc,1);
              goto LAB_0030df8c;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_490 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else if (local_564 == Half) {
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar19 = vpandd_avx512vl(ZEXT416(*(uint *)((long)local_4c0.ptr + lVar11)),auVar19);
            fVar8 = auVar19._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar5 = vmovmskps_avx(ZEXT416(*(uint *)((long)local_4c0.ptr + lVar11)));
            uVar6 = (uint)(iVar5 << 0x1f) >> 0x10;
            uVar9 = (uVar6 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_130 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                        ((uVar6 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            FVar20 = pbrt::Image::GetChannel(&local_248,PVar17,(int)lVar12,(WrapMode2D)0x200000002);
            local_530._0_4_ = FVar20;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_490,"Float(Half(rgbPixels[offset]))",
                       "image.GetChannel({x, y}, c)",(float *)&local_130,(float *)local_530);
            if (local_490[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_130.__align);
              if ((undefined8 *)CONCAT44(local_490._12_4_,local_490._8_4_) == (undefined8 *)0x0) {
                pcVar13 = "";
              }
              else {
                pcVar13 = *(char **)CONCAT44(local_490._12_4_,local_490._8_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_530,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x157,pcVar13);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_530,(Message *)&local_130.__align);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_530);
              if (((CONCAT44(uStack_12c,local_130) != 0) &&
                  (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 ((long *)CONCAT44(uStack_12c,local_130) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(uStack_12c,local_130) + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_490 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_0030def8;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_490 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar11 = lVar11 + 4;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 3);
        uVar16 = uVar16 + 1;
        uVar15 = (int)uVar15 + lVar12;
      } while (uVar16 != 0x10);
      lVar11 = local_270 + 1;
      uVar15 = (int)local_4c8 + lVar12;
    } while (lVar11 != 0x31);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    uStack_12c = uStack_12c & 0xffffff00;
    local_e8 = 0;
    local_a4 = 0;
    local_90 = 0;
    local_84 = 0;
    local_7c = 0;
    local_74 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_490._0_8_ = local_480;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70 = pbrt::RGBColorSpace::ACES2065_1;
    local_68 = 1;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"test.exr","");
    bVar4 = pbrt::Image::Write(&local_248,(string *)local_490,(ImageMetadata *)&local_130.__align);
    pfVar1 = (float *)(local_530 + 0x10);
    local_530[0] = (internal)bVar4;
    local_530._8_8_ = (float *)0x0;
    if ((undefined1 *)local_490._0_8_ == local_480) {
      if (!bVar4) goto LAB_0030d12a;
    }
    else {
      operator_delete((void *)local_490._0_8_,local_480._0_8_ + 1);
      if ((local_530._0_8_ & 1) == 0) {
LAB_0030d12a:
        testing::Message::Message((Message *)&local_560);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_490,(internal *)local_530,
                   (AssertionResult *)"image.Write(\"test.exr\", metadata)","false","true",
                   (char *)encoding);
        testing::internal::AssertHelper::AssertHelper
                  (&local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x15e,(char *)local_490._0_8_);
        testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_560);
        testing::internal::AssertHelper::~AssertHelper(&local_580);
        if ((undefined1 *)local_490._0_8_ != local_480) {
          operator_delete((void *)local_490._0_8_,local_480._0_8_ + 1);
        }
        if ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
              (Tuple2<pbrt::Point2,_int>)0x0)) {
            (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 8))();
          }
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_530 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_530._0_8_ = pfVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"test.exr","");
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    local_268.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_490,(string *)local_530,AVar7,&local_268);
    pcVar13 = (char *)local_490._0_8_;
    if ((float *)local_530._0_8_ != pfVar1) {
      operator_delete((void *)local_530._0_8_,local_520._M_allocated_capacity + 1);
      pcVar13 = (char *)local_490._0_8_;
    }
    local_490._4_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
    expected_predicate_value = (AssertHelperData *)CONCAT44(local_490._8_4_,local_490._4_4_);
    local_560.offset.alloc.memoryResource =
         (memory_resource *)local_248.resolution.super_Tuple2<pbrt::Point2,_int>;
    local_580.data_ = expected_predicate_value;
    local_490._0_8_ = pcVar13;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)local_530,"image.Resolution()","read.image.Resolution()",
               (Point2<int> *)&local_560,(Point2<int> *)&local_580);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_560);
      pcVar13 = "";
      if ((float *)local_530._8_8_ != (float *)0x0) {
        pcVar13 = *(char **)local_530._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x162,pcVar13);
      testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_560);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      if ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_530 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    expected = pbrt::RGBColorSpace::ACES2065_1;
    actual = pbrt::ImageMetadata::GetColorSpace(&local_378);
    testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
              ((internal *)local_530,"*RGBColorSpace::ACES2065_1","*read.metadata.GetColorSpace()",
               expected,actual);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_560);
      pcVar13 = "";
      if ((float *)local_530._8_8_ != (float *)0x0) {
        pcVar13 = *(char **)local_530._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x163,pcVar13);
      testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_560);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      if ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_530 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_564 != U256) {
      local_560.offset.alloc.memoryResource._0_4_ = local_490._0_4_;
      testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
                ((internal *)local_530,"read.image.Format()","format",(PixelFormat *)&local_560,
                 &local_564);
      if (local_530[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_560);
        pcVar13 = "";
        if ((float *)local_530._8_8_ != (float *)0x0) {
          pcVar13 = *(char **)local_530._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x165,pcVar13);
        testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_560);
        testing::internal::AssertHelper::~AssertHelper(&local_580);
        if ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((Tuple2<pbrt::Point2,_int>)local_560.offset.alloc.memoryResource !=
              (Tuple2<pbrt::Point2,_int>)0x0)) {
            (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_530 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_530._0_8_ = pfVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"R","");
    local_510 = local_500;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"G","");
    local_4f0[0] = local_4e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr = (string *)local_530;
    pbrt::Image::GetChannelDesc(&local_560,(Image *)local_490,requestedChannels);
    lVar11 = -0x60;
    plVar18 = local_4e0;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    local_580.data_._0_1_ = (internal)(local_560.offset.nStored != 0);
    local_578.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_560.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_588);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_530,(internal *)&local_580,(AssertionResult *)"bool(rgbDesc)",
                 "false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_570,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x168,(char *)local_530._0_8_);
      testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
      testing::internal::AssertHelper::~AssertHelper(&local_570);
      if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
        operator_delete((void *)local_530._0_8_,local_520._M_allocated_capacity + 1);
      }
      if (CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_578,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_560.offset.nStored = 0;
      (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 0x18))
                (local_560.offset.alloc.memoryResource,local_560.offset.ptr,
                 local_560.offset.nAlloc << 2,4);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_378.stringVectors._M_t);
      if (local_378.colorSpace.set == true) {
        local_378.colorSpace.set = false;
      }
      if (local_378.MSE.set == true) {
        local_378.MSE.set = false;
      }
      if (local_378.samplesPerPixel.set == true) {
        local_378.samplesPerPixel.set = false;
      }
      if (local_378.fullResolution.set == true) {
        local_378.fullResolution.set = false;
      }
      if (local_378.pixelBounds.set == true) {
        local_378.pixelBounds.set = false;
      }
      if (local_378.NDCFromWorld.set == true) {
        local_378.NDCFromWorld.set = false;
      }
      if (local_378.cameraFromWorld.set == true) {
        local_378.cameraFromWorld.set = false;
      }
      if (local_378.renderTimeSeconds.set == true) {
        local_378.renderTimeSeconds.set = false;
      }
      local_380 = 0;
      (*(local_398.memoryResource)->_vptr_memory_resource[3])
                (local_398.memoryResource,local_390,local_388 << 2,4);
      local_3a0 = 0;
      (*(local_3b8.memoryResource)->_vptr_memory_resource[3])
                (local_3b8.memoryResource,local_3b0,local_3a8 * 2,2);
      local_3c0 = 0;
      (*(local_3d8.memoryResource)->_vptr_memory_resource[3])
                (local_3d8.memoryResource,local_3d0,local_3c8,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_480);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_60);
      local_248.p32.nStored = 0;
      (*(local_248.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_248.p32.alloc.memoryResource,local_248.p32.ptr,local_248.p32.nAlloc << 2,4);
      local_248.p16.nStored = 0;
      (*(local_248.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_248.p16.alloc.memoryResource,local_248.p16.ptr,local_248.p16.nAlloc * 2,2);
      local_248.p8.nStored = 0;
      (*(local_248.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_248.p8.alloc.memoryResource,local_248.p8.ptr,local_248.p8.nAlloc,1);
LAB_0030df8c:
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_248.channelNames);
      goto LAB_0030df99;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_578,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar15 = 0;
    do {
      local_4c8 = uVar15 << 0x20;
      uVar16 = 0;
      local_4e0[2] = uVar15;
      do {
        PVar17.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_4c8 | uVar16);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_530,(Image *)local_490,PVar17,&local_560,
                   (WrapMode2D)0x200000002);
        lVar12 = 0;
        lVar11 = 0;
        do {
          iVar5 = (int)lVar11;
          if (local_564 == Half) {
            auVar22._0_4_ = pbrt::Image::GetChannel(&local_248,PVar17,iVar5,(WrapMode2D)0x200000002)
            ;
            auVar22._4_60_ = extraout_var_00;
            auVar3._8_4_ = 0x7fffffff;
            auVar3._0_8_ = 0x7fffffff7fffffff;
            auVar3._12_4_ = 0x7fffffff;
            auVar19 = vandps_avx512vl(auVar22._0_16_,auVar3);
            fVar8 = auVar19._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar5 = vmovmskps_avx(auVar22._0_16_);
            uVar6 = (uint)(iVar5 << 0x1f) >> 0x10;
            uVar9 = (uVar6 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_588.data_._0_4_ = (Float)((uVar6 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            pfVar14 = (float *)local_530._8_8_;
            if ((float *)local_530._8_8_ == (float *)0x0) {
              pfVar14 = pfVar1;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_580,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_588,(float *)((long)pfVar14 + lVar12));
            if (local_580.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_588);
              pcVar13 = "";
              if (local_578.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar13 = ((local_578.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_570,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x171,pcVar13);
              testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
              testing::internal::AssertHelper::~AssertHelper(&local_570);
              if (CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != 0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   ((long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 8))
                            ();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_578,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else if (local_564 == U256) {
            auVar21._0_4_ = pbrt::Image::GetChannel(&local_248,PVar17,iVar5,(WrapMode2D)0x200000002)
            ;
            auVar21._4_60_ = extraout_var;
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar19 = vandps_avx512vl(auVar21._0_16_,auVar2);
            fVar8 = auVar19._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar5 = vmovmskps_avx(auVar21._0_16_);
            uVar6 = (uint)(iVar5 << 0x1f) >> 0x10;
            uVar9 = (uVar6 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_588.data_._0_4_ = (Float)((uVar6 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            pfVar14 = (float *)local_530._8_8_;
            if ((float *)local_530._8_8_ == (float *)0x0) {
              pfVar14 = pfVar1;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_580,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_588,(float *)((long)pfVar14 + lVar12));
            if (local_580.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_588);
              pcVar13 = "";
              if (local_578.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar13 = ((local_578.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_570,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x16f,pcVar13);
              testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
              testing::internal::AssertHelper::~AssertHelper(&local_570);
              if (CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != 0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   ((long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 8))
                            ();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_578,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            local_588.data_._0_4_ =
                 pbrt::Image::GetChannel(&local_248,PVar17,iVar5,(WrapMode2D)0x200000002);
            pfVar14 = (float *)local_530._8_8_;
            if ((float *)local_530._8_8_ == (float *)0x0) {
              pfVar14 = pfVar1;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_580,"image.GetChannel({x, y}, c)","v[c]",
                       (float *)&local_588,(float *)((long)pfVar14 + lVar12));
            if (local_580.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_588);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         " @ (",4);
              std::ostream::operator<<
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         (int)uVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         ", ",2);
              std::ostream::operator<<
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         (int)local_4e0[2]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         ", ch ",5);
              std::ostream::operator<<
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         iVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 0x10),
                         ")",1);
              pcVar13 = "";
              if (local_578.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar13 = ((local_578.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_570,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x173,pcVar13);
              testing::internal::AssertHelper::operator=(&local_570,(Message *)&local_588);
              testing::internal::AssertHelper::~AssertHelper(&local_570);
              if (CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != 0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) &&
                   ((long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_588.data_._4_4_,local_588.data_._0_4_) + 8))
                            ();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_578,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + 4;
        } while (lVar11 != 3);
        local_508 = 0;
        (**(code **)(*(long *)local_530._0_8_ + 0x18))
                  (local_530._0_8_,local_530._8_8_,(long)local_510 << 2,4);
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x10);
      uVar15 = local_4e0[2] + 1;
    } while (uVar15 != 0x31);
    local_580.data_ = local_580.data_ & 0xffffffff00000000;
    local_588.data_._0_4_ = (Float)remove("test.exr");
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_530,"0","remove(\"test.exr\")",(int *)&local_580,(int *)&local_588)
    ;
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_580);
      pcVar13 = "";
      if ((float *)local_530._8_8_ != (float *)0x0) {
        pcVar13 = *(char **)local_530._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_588,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x177,pcVar13);
      testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_580);
      testing::internal::AssertHelper::~AssertHelper(&local_588);
      if (local_580.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_580.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_580.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_530 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_560.offset.nStored = 0;
    (**(code **)(*(long *)local_560.offset.alloc.memoryResource + 0x18))
              (local_560.offset.alloc.memoryResource,local_560.offset.ptr,
               local_560.offset.nAlloc << 2,4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_378.stringVectors._M_t);
    if (local_378.colorSpace.set == true) {
      local_378.colorSpace.set = false;
    }
    if (local_378.MSE.set == true) {
      local_378.MSE.set = false;
    }
    if (local_378.samplesPerPixel.set == true) {
      local_378.samplesPerPixel.set = false;
    }
    if (local_378.fullResolution.set == true) {
      local_378.fullResolution.set = false;
    }
    if (local_378.pixelBounds.set == true) {
      local_378.pixelBounds.set = false;
    }
    if (local_378.NDCFromWorld.set == true) {
      local_378.NDCFromWorld.set = false;
    }
    if (local_378.cameraFromWorld.set == true) {
      local_378.cameraFromWorld.set = false;
    }
    if (local_378.renderTimeSeconds.set == true) {
      local_378.renderTimeSeconds.set = false;
    }
    local_380 = 0;
    (*(local_398.memoryResource)->_vptr_memory_resource[3])
              (local_398.memoryResource,local_390,local_388 << 2,4);
    local_3a0 = 0;
    (*(local_3b8.memoryResource)->_vptr_memory_resource[3])
              (local_3b8.memoryResource,local_3b0,local_3a8 * 2,2);
    local_3c0 = 0;
    (*(local_3d8.memoryResource)->_vptr_memory_resource[3])
              (local_3d8.memoryResource,local_3d0,local_3c8,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_480);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_60);
    local_248.p32.nStored = 0;
    (*(local_248.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_248.p32.alloc.memoryResource,local_248.p32.ptr,local_248.p32.nAlloc << 2,4);
    local_248.p16.nStored = 0;
    (*(local_248.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_248.p16.alloc.memoryResource,local_248.p16.ptr,local_248.p16.nAlloc * 2,2);
    local_248.p8.nStored = 0;
    (*(local_248.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_248.p8.alloc.memoryResource,local_248.p8.ptr,local_248.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_248.channelNames);
    lVar11 = local_278 + 4;
    if (lVar11 == 0xc) {
LAB_0030df99:
      local_4c0.nStored = 0;
      (*(local_4c0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_4c0.alloc.memoryResource,local_4c0.ptr,local_4c0.nAlloc << 2,4);
      return;
    }
  } while( true );
}

Assistant:

TEST(Image, ExrIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        image.CopyRectIn({{0, 0}, res}, rgbPixels);

        // Check CopyRectIn()
        int offset = 0;
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < 3; ++c, ++offset) {
                    if (format == PixelFormat::U256)
                        ;
                    else if (format == PixelFormat::Half)
                        ASSERT_EQ(Float(Half(rgbPixels[offset])),
                                  image.GetChannel({x, y}, c));
                    else if (format == PixelFormat::Float)
                        ASSERT_EQ(rgbPixels[offset], image.GetChannel({x, y}, c));
                }

        ImageMetadata metadata;
        metadata.colorSpace = RGBColorSpace::ACES2065_1;
        EXPECT_TRUE(image.Write("test.exr", metadata));

        ImageAndMetadata read = Image::Read("test.exr");

        EXPECT_EQ(image.Resolution(), read.image.Resolution());
        EXPECT_EQ(*RGBColorSpace::ACES2065_1, *read.metadata.GetColorSpace());
        if (!Is8Bit(format))
            EXPECT_EQ(read.image.Format(), format);

        ImageChannelDesc rgbDesc = read.image.GetChannelDesc({"R", "G", "B"});
        ASSERT_TRUE(bool(rgbDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues v = read.image.GetChannels({x, y}, rgbDesc);
                for (int c = 0; c < 3; ++c)
                    if (Is8Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else if (Is16Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else
                        EXPECT_EQ(image.GetChannel({x, y}, c), v[c])
                            << " @ (" << x << ", " << y << ", ch " << c << ")";
            }

        EXPECT_EQ(0, remove("test.exr"));
    }
}